

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

void __thiscall CppGenerator::computeViewOrdering(CppGenerator *this)

{
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_00;
  undefined8 *puVar1;
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar2;
  uint uVar3;
  iterator iVar4;
  element_type *peVar5;
  unsigned_long *puVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  CppGenerator *pCVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  size_t *psVar13;
  pointer puVar14;
  View *pVVar15;
  TDNode *pTVar16;
  size_t __n;
  unsigned_long uVar17;
  long lVar18;
  ulong uVar19;
  ulong *puVar20;
  pointer puVar21;
  size_t *incView;
  long lVar22;
  long lVar23;
  size_t *nodeID;
  uint uVar24;
  size_t *destView;
  unsigned_long *puVar25;
  size_t *viewID;
  long lVar26;
  long lVar27;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> orderedViewList;
  size_t viewID_1;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> nodesToProcess;
  dyn_bitset processedViews;
  dyn_bitset queuedViews;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  viewsPerNode;
  allocator_type local_151;
  CppGenerator *local_150;
  size_t *local_148;
  iterator iStack_140;
  unsigned_long *local_138;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_130;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_118;
  View *local_c0;
  size_t local_b8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  long local_70;
  pointer local_68;
  long local_60;
  Aggregate *local_58;
  long local_50;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_48;
  
  sVar10 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = sVar10;
  uVar11 = SUB168(auVar8 * ZEXT816(0x18),0);
  uVar12 = uVar11 + 8;
  if (0xfffffffffffffff7 < uVar11) {
    uVar12 = 0xffffffffffffffff;
  }
  uVar11 = 0xffffffffffffffff;
  if (SUB168(auVar8 * ZEXT816(0x18),8) == 0) {
    uVar11 = uVar12;
  }
  psVar13 = (size_t *)operator_new__(uVar11);
  *psVar13 = sVar10;
  if (sVar10 != 0) {
    lVar18 = 0;
    do {
      puVar1 = (undefined8 *)
               ((long)&(((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(psVar13 + 1))->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar18);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)psVar13 + lVar18 + 0x18) = 0;
      lVar18 = lVar18 + 0x18;
    } while (sVar10 * 0x18 != lVar18);
  }
  this->incomingViews = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(psVar13 + 1);
  sVar10 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  psVar13 = (size_t *)operator_new__(-(ulong)(sVar10 >> 0x3d != 0) | sVar10 * 8);
  this->viewToGroupMapping = psVar13;
  sVar10 = TreeDecomposition::numberOfRelations
                     ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  local_118._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&local_48,sVar10,(value_type *)&local_118,(allocator_type *)&local_b0);
  if (local_118._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
    operator_delete(local_118._M_impl.super__Deque_impl_data._M_map);
  }
  puVar21 = (pointer)0x0;
  local_150 = this;
  while (local_b0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start = puVar21,
        puVar14 = (pointer)QueryCompiler::numberOfViews
                                     ((this->_qc).
                                      super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr), puVar21 < puVar14) {
    pVVar15 = QueryCompiler::getView
                        ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,(size_t)local_b0.m_bits.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
    pTVar16 = TreeDecomposition::getRelation
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (ulong)pVVar15->_origin);
    uVar3 = pVVar15->_origin;
    uVar24 = pVVar15->_destination;
    sVar10 = pTVar16->_numOfNeighbors;
    local_c0 = pVVar15;
    __n = QueryCompiler::numberOfViews
                    ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
    local_90.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)local_90.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&local_118,__n,(bool *)&local_90,
               (allocator_type *)&local_148);
    pVVar15 = local_c0;
    this = local_150;
    local_68 = (local_c0->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    lVar18 = (long)(local_c0->_aggregates).
                   super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)local_68;
    if (lVar18 != 0) {
      lVar26 = sVar10 - (uVar3 != uVar24);
      lVar18 = lVar18 >> 3;
      local_70 = lVar18 + (ulong)(lVar18 == 0);
      local_50 = lVar26 * 0x10;
      lVar18 = 0;
      do {
        local_60 = lVar18;
        local_58 = local_68[local_60];
        lVar18 = (long)*(pointer *)
                        ((long)&(local_58->_agg).
                                super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                ._M_impl + 8) -
                 *(long *)&(local_58->_agg).
                           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                           ._M_impl;
        if (lVar18 != 0) {
          lVar22 = (lVar18 >> 6) * -0x5555555555555555;
          lVar23 = 0;
          lVar18 = 0;
          do {
            if (lVar26 != 0) {
              puVar20 = (ulong *)(*(long *)&(local_58->_incoming).
                                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                            ._M_impl.super__Vector_impl_data + lVar23);
              lVar27 = lVar26;
              do {
                uVar11 = *puVar20;
                uVar12 = uVar11 + 0x3f;
                if (-1 < (long)uVar11) {
                  uVar12 = uVar11;
                }
                local_118._M_impl.super__Deque_impl_data._M_map
                [((long)uVar12 >> 6) +
                 ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                     (unsigned_long *)
                     ((ulong)local_118._M_impl.super__Deque_impl_data._M_map
                             [((long)uVar12 >> 6) +
                              ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                     1L << ((byte)uVar11 & 0x3f));
                puVar20 = puVar20 + 2;
                lVar27 = lVar27 + -1;
              } while (lVar27 != 0);
            }
            lVar18 = lVar18 + 1;
            lVar23 = lVar23 + local_50;
          } while (lVar18 != lVar22 + (ulong)(lVar22 == 0));
        }
        lVar18 = local_60 + 1;
      } while (local_60 + 1 != local_70);
    }
    puVar21 = (pointer)0x0;
    while (local_90.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start = puVar21,
          puVar14 = (pointer)QueryCompiler::numberOfViews
                                       ((this->_qc).
                                        super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr), puVar21 < puVar14) {
      puVar21 = (pointer)((long)local_90.m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + 0x3f);
      if (-1 < (long)local_90.m_bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start) {
        puVar21 = local_90.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      }
      if (((ulong)local_118._M_impl.super__Deque_impl_data._M_map
                  [((long)puVar21 >> 6) +
                   ((ulong)(((ulong)local_90.m_bits.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start & 0x800000000000003f)
                           < 0x8000000000000001) - 1)] >>
           ((ulong)local_90.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start & 0x3f) & 1) != 0) {
        pvVar2 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                 (this->incomingViews +
                 (long)local_b0.m_bits.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start);
        iVar4._M_current = *(unsigned_long **)(pvVar2 + 8);
        if (iVar4._M_current == *(unsigned_long **)(pvVar2 + 0x10)) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>(pvVar2,iVar4,(unsigned_long *)&local_90);
        }
        else {
          *iVar4._M_current =
               (unsigned_long)
               local_90.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
          *(unsigned_long **)(pvVar2 + 8) = iVar4._M_current + 1;
        }
      }
      puVar21 = (pointer)((long)local_90.m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + 1);
    }
    pvVar2 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
             (local_48.
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + pVVar15->_origin);
    iVar4._M_current = *(unsigned_long **)(pvVar2 + 8);
    if (iVar4._M_current == *(unsigned_long **)(pvVar2 + 0x10)) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>(pvVar2,iVar4,(unsigned_long *)&local_b0);
    }
    else {
      *iVar4._M_current =
           (unsigned_long)
           local_b0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
      *(unsigned_long **)(pvVar2 + 8) = iVar4._M_current + 1;
    }
    if (local_118._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
      operator_delete(local_118._M_impl.super__Deque_impl_data._M_map);
    }
    puVar21 = (pointer)((long)local_b0.m_bits.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + 1);
  }
  sVar10 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_b0,sVar10,0,(allocator<unsigned_long> *)&local_118);
  sVar10 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_90,sVar10,0,(allocator<unsigned_long> *)&local_118);
  local_148 = (size_t *)0x0;
  iStack_140._M_current = (unsigned_long *)0x0;
  local_138 = (unsigned_long *)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_cur = (unsigned_long *)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_last = (unsigned_long *)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_cur = (unsigned_long *)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_first = (unsigned_long *)0x0;
  local_118._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map(&local_118,0);
  peVar5 = (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  puVar21 = (peVar5->_leafNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar14 = (peVar5->_leafNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (puVar21 != puVar14) {
    do {
      puVar6 = local_48.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*puVar21].
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar25 = local_48.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[*puVar21].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar25 != puVar6; puVar25 = puVar25 + 1) {
        uVar11 = *puVar25;
        if (local_150->incomingViews[uVar11].
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_150->incomingViews[uVar11].
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_90.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11 >> 6] =
               local_90.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar11 >> 6] | 1L << ((byte)uVar11 & 0x3f);
          if (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_118._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<unsigned_long,std::allocator<unsigned_long>>::
            _M_push_back_aux<unsigned_long_const&>
                      ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_118,puVar25);
          }
          else {
            *local_118._M_impl.super__Deque_impl_data._M_finish._M_cur = *puVar25;
            local_118._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_118._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
      }
      puVar21 = puVar21 + 1;
    } while (puVar21 != puVar14);
  }
  if (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_118._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      local_130.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)*local_118._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_118._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_118._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_118._M_impl.super__Deque_impl_data._M_start._M_first);
        local_118._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_118._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_118._M_impl.super__Deque_impl_data._M_start._M_last =
             local_118._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        local_118._M_impl.super__Deque_impl_data._M_start._M_first =
             local_118._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_118._M_impl.super__Deque_impl_data._M_start._M_node =
             local_118._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_118._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_118._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      if (iStack_140._M_current == local_138) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_148,iStack_140,
                   (unsigned_long *)&local_130);
      }
      else {
        *iStack_140._M_current =
             (unsigned_long)
             local_130.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        iStack_140._M_current = iStack_140._M_current + 1;
      }
      local_b0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start
      [(ulong)local_130.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start >> 6] =
           local_b0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start
           [(ulong)local_130.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 6] |
           1L << ((byte)local_130.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0x3f);
      pVVar15 = QueryCompiler::getView
                          ((local_150->_qc).
                           super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           (size_t)local_130.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
      puVar6 = local_48.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[pVVar15->_destination].
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar25 = local_48.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[pVVar15->_destination].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar25 != puVar6; puVar25 = puVar25 + 1) {
        uVar11 = *puVar25;
        uVar19 = 1L << ((byte)uVar11 & 0x3f);
        uVar12 = uVar11 >> 6;
        if ((local_b0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar12] >> (uVar11 & 0x3f) & 1) == 0) {
          for (puVar20 = local_150->incomingViews[uVar11].
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
              puVar20 !=
              local_150->incomingViews[uVar11].
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish; puVar20 = puVar20 + 1) {
            uVar7 = *puVar20;
            if (((local_b0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) == 0)
               && ((local_90.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar7 >> 6] & 1L << ((byte)uVar7 & 0x3f)) == 0)
               ) goto LAB_0022b43a;
          }
          if ((local_90.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar12] & uVar19) == 0) {
            local_90.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar12] =
                 local_90.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar12] | uVar19;
            if (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_118._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<unsigned_long,std::allocator<unsigned_long>>::
              _M_push_back_aux<unsigned_long_const&>
                        ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_118,puVar25);
            }
            else {
              *local_118._M_impl.super__Deque_impl_data._M_finish._M_cur = *puVar25;
              local_118._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_118._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
          }
        }
LAB_0022b43a:
      }
    } while (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_118._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  pCVar9 = local_150;
  pVVar15 = QueryCompiler::getView
                      ((local_150->_qc).
                       super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       *local_148);
  uVar24 = pVVar15->_origin;
  local_b8 = *local_148;
  __l._M_len = 1;
  __l._M_array = &local_b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_130,__l,&local_151);
  this_00 = &pCVar9->viewGroups;
  std::
  vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
  ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              *)this_00,&local_130);
  if (local_130.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pCVar9->viewToGroupMapping[*local_148] = 0;
  if (8 < (ulong)((long)iStack_140._M_current - (long)local_148)) {
    uVar11 = 1;
    sVar10 = 0;
    do {
      pVVar15 = QueryCompiler::getView
                          ((local_150->_qc).
                           super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           local_148[uVar11]);
      uVar3 = pVVar15->_origin;
      if ((multifaq::cppgen::MULTI_OUTPUT == '\x01') && (uVar24 == uVar3)) {
        pvVar2 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                 ((this_00->
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + sVar10);
        iVar4._M_current = *(unsigned_long **)(pvVar2 + 8);
        if (iVar4._M_current == *(unsigned_long **)(pvVar2 + 0x10)) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>(pvVar2,iVar4,local_148 + uVar11);
          uVar17 = local_148[uVar11];
        }
        else {
          uVar17 = local_148[uVar11];
          *iVar4._M_current = uVar17;
          *(unsigned_long **)(pvVar2 + 8) = iVar4._M_current + 1;
        }
        local_150->viewToGroupMapping[uVar17] = sVar10;
      }
      else {
        local_b8 = local_148[uVar11];
        __l_00._M_len = 1;
        __l_00._M_array = &local_b8;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_130,__l_00,&local_151);
        std::
        vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
        ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                  ((vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    *)this_00,&local_130);
        if (local_130.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_130.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        sVar10 = sVar10 + 1;
        local_150->viewToGroupMapping[local_148[uVar11]] = sVar10;
      }
      uVar11 = uVar11 + 1;
      uVar24 = uVar3;
    } while (uVar11 < (ulong)((long)iStack_140._M_current - (long)local_148 >> 3));
  }
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_118);
  if (local_148 != (size_t *)0x0) {
    operator_delete(local_148);
  }
  if (local_90.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void CppGenerator::computeViewOrdering()
{
    incomingViews = new std::vector<size_t>[_qc->numberOfViews()]();
    viewToGroupMapping = new size_t[_qc->numberOfViews()];

    std::vector<std::vector<size_t>> viewsPerNode(
        _td->numberOfRelations(), std::vector<size_t>());
    
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* view = _qc->getView(viewID);
        TDNode* baseRelation = _td->getRelation(view->_origin);
        
        size_t numberIncomingViews =
            (view->_origin == view->_destination ? baseRelation->_numOfNeighbors :
             baseRelation->_numOfNeighbors - 1);
        
        std::vector<bool> incViewBitset(_qc->numberOfViews());
        for (size_t aggNo = 0; aggNo < view->_aggregates.size(); ++aggNo)
        {
            Aggregate* aggregate = view->_aggregates[aggNo];

            size_t incOffset = 0;
            // First find the all views that contribute to this Aggregate
            for (size_t i = 0; i < aggregate->_agg.size(); ++i)
            {
                for (size_t j = 0; j < numberIncomingViews; ++j)
                {
                    const size_t& incViewID = aggregate->_incoming[incOffset].first;
               
                    // Indicate that this view contributes to some aggregate
                    incViewBitset[incViewID] = 1;
                    ++incOffset;
                }
            }
        }        
        // For each incoming view, check if it contains any vars from the
        // variable order and then add it to the corresponding info
        for (size_t incViewID=0; incViewID < _qc->numberOfViews(); ++incViewID)
            if (incViewBitset[incViewID])
                incomingViews[viewID].push_back(incViewID);

        // Keep track of the views that origin from this node 
        viewsPerNode[view->_origin].push_back(viewID);
    }
    
    /* Next compute the topological order of the views */
    dyn_bitset processedViews(_qc->numberOfViews());
    dyn_bitset queuedViews(_qc->numberOfViews());
    
    // create orderedViewList -> which is empty
    std::vector<size_t> orderedViewList;
    std::queue<size_t> nodesToProcess;
    
    // Find all views that originate from leaf nodes
    for (const size_t& nodeID : _td->_leafNodes)
    {
        for (const size_t& viewID : viewsPerNode[nodeID])
        {
            if (incomingViews[viewID].size() == 0)
            {
                queuedViews.set(viewID);
                nodesToProcess.push(viewID);
            }
        }
    }
    
    while (!nodesToProcess.empty()) // there is a node in the set
    {
        size_t viewID = nodesToProcess.front();
        nodesToProcess.pop();

        orderedViewList.push_back(viewID);
        processedViews.set(viewID);

        const size_t& destination = _qc->getView(viewID)->_destination;

        // For each view that has the same destination 
        for (const size_t& destView : viewsPerNode[destination])
        {
            // check if this has not been processed (case for root nodes)
            if (!processedViews[destView])
            {
                bool candidate = true;
                for (const size_t& incView : incomingViews[destView])
                {    
                    if (!processedViews[incView] && !queuedViews[incView])
                    {
                        candidate = false;
                        break;
                    }
                }
                
                if (candidate && !queuedViews[destView])
                {
                    queuedViews.set(destView);
                    nodesToProcess.push(destView);
                }
            }
        }
    }

    /* Now generate the groups of views according to topological order*/
    size_t prevOrigin = _qc->getView(orderedViewList[0])->_origin;
    viewGroups.push_back({orderedViewList[0]});

    viewToGroupMapping[orderedViewList[0]] = 0;    
    size_t currentGroup = 0;
    for (size_t viewID = 1; viewID < orderedViewList.size(); ++viewID)
    {
        size_t origin = _qc->getView(orderedViewList[viewID])->_origin;
        if (MULTI_OUTPUT && prevOrigin == origin)
        {
            // Combine the two into one set of
            viewGroups[currentGroup].push_back(orderedViewList[viewID]);
            viewToGroupMapping[orderedViewList[viewID]] = currentGroup;
        }
        else
        {
            // Create a new group
            viewGroups.push_back({orderedViewList[viewID]});
            ++currentGroup;
            viewToGroupMapping[orderedViewList[viewID]] = currentGroup;
        }
        prevOrigin = origin;
    }

    /**************** PRINT OUT **********************/
    DINFO("Ordered View List: ");
    for (size_t& i : orderedViewList)
        DINFO(i << ", ");
    DINFO(std::endl);
    DINFO("View Groups: ");
    for (auto& group : viewGroups) {
        for (auto& i : group)
            DINFO(i << "  ");
        DINFO("|");
    }
    DINFO(std::endl);
    /**************** PRINT OUT **********************/
}